

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::anon_unknown_4::MTThreadBody(void *arg)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  undefined4 uVar4;
  bool bVar5;
  char *pcVar6;
  undefined8 uVar7;
  Message *message;
  long lVar8;
  AssertHelper local_800;
  Message local_7f8;
  int local_7ec;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar_6;
  Message local_7d0;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_5;
  Message local_7b0;
  int local_7a4;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_4;
  Message local_788;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_3;
  Message local_768;
  int local_760;
  int local_75c;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_2;
  int local_740;
  int c;
  int w;
  int k;
  Message local_730;
  char local_721;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_1;
  ReadOptions local_700;
  Status local_6f0;
  Status s;
  AssertHelper local_6e0;
  Message local_6d8;
  Slice local_6d0;
  Slice local_6c0;
  WriteOptions local_6a9;
  Status local_6a8;
  char local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar;
  char keybuf [20];
  uint local_66c;
  char local_668 [4];
  int key;
  char valbuf [1500];
  undefined1 local_80 [8];
  string value;
  Random rnd;
  int counter;
  DB *db;
  int id;
  MTThread *t;
  void *arg_local;
  memory_order __b;
  memory_order __b_1;
  
  uVar1 = *(uint *)((long)arg + 8);
  plVar2 = *(long **)(**arg + 0x38);
  value.field_2._12_4_ = 0;
  fprintf(_stderr,"... starting thread %d\n",(ulong)uVar1);
  Random::Random((Random *)((long)&value.field_2 + 8),uVar1 + 1000);
  std::__cxx11::string::string((string *)local_80);
  while (bVar5 = std::atomic<bool>::load((atomic<bool> *)(*arg + 8),memory_order_acquire),
        uVar4 = value.field_2._12_4_, ((bVar5 ^ 0xffU) & 1) != 0) {
    lVar3 = *arg;
    std::operator&(memory_order_release,__memory_order_mask);
    *(undefined4 *)(lVar3 + 0xc + (long)(int)uVar1 * 4) = uVar4;
    local_66c = Random::Uniform((Random *)((long)&value.field_2 + 8),1000);
    snprintf((char *)&gtest_ar.message_,0x14,"%016d",(ulong)local_66c);
    bVar5 = Random::OneIn((Random *)((long)&value.field_2 + 8),2);
    if (bVar5) {
      snprintf(local_668,0x5dc,"%d.%d.%-1000d",(ulong)local_66c,(ulong)uVar1,
               (ulong)(uint)value.field_2._12_4_);
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      memset(&local_6a9,0,1);
      WriteOptions::WriteOptions(&local_6a9);
      Slice::Slice(&local_6c0,(char *)&gtest_ar.message_);
      Slice::Slice(&local_6d0,local_668);
      (**(code **)(*plVar2 + 0x10))(&local_6a8,plVar2,&local_6a9,&local_6c0,&local_6d0);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_698,&local_699,
                 (Status *)"db->Put(WriteOptions(), Slice(keybuf), Slice(valbuf))");
      Status::~Status(&local_6a8);
      bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
      if (!bVar5) {
        testing::Message::Message(&local_6d8);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
        testing::internal::AssertHelper::AssertHelper
                  (&local_6e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x7ab,pcVar6);
        testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
        testing::internal::AssertHelper::~AssertHelper(&local_6e0);
        testing::Message::~Message(&local_6d8);
      }
      s.state_._5_3_ = 0;
      s.state_._4_1_ = !bVar5;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
    }
    else {
      memset(&local_700,0,0x10);
      ReadOptions::ReadOptions(&local_700);
      Slice::Slice((Slice *)&gtest_ar_1.message_,(char *)&gtest_ar.message_);
      (**(code **)(*plVar2 + 0x28))(&local_6f0,plVar2,&local_700,&gtest_ar_1.message_,local_80);
      bVar5 = Status::IsNotFound(&local_6f0);
      if (bVar5) {
LAB_00135525:
        s.state_._4_4_ = 0;
      }
      else {
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_720,&local_721
                   ,(Status *)0x1e0819);
        bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
        if (!bVar5) {
          testing::Message::Message(&local_730);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&w,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x7b3,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&w,&local_730);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&w);
          testing::Message::~Message(&local_730);
        }
        s.state_._5_3_ = 0;
        s.state_._4_1_ = !bVar5;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
        if (s.state_._4_4_ == 0) {
          local_75c = 3;
          uVar7 = std::__cxx11::string::c_str();
          local_760 = __isoc99_sscanf(uVar7,"%d.%d.%d",&c,&local_740,
                                      (undefined1 *)
                                      ((long)&gtest_ar_2.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      + 4));
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_758,"3","sscanf(value.c_str(), \"%d.%d.%d\", &k, &w, &c)",
                     &local_75c,&local_760);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
          if (!bVar5) {
            testing::Message::Message(&local_768);
            message = testing::Message::operator<<
                                (&local_768,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_80);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x7b5,pcVar6);
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,message)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_768);
          }
          s.state_._5_3_ = 0;
          s.state_._4_1_ = !bVar5;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
          if (s.state_._4_4_ == 0) {
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_780,"k","key",&c,(int *)&local_66c);
            bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
            if (!bVar5) {
              testing::Message::Message(&local_788);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,0x7b6,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_788);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_788);
            }
            s.state_._5_3_ = 0;
            s.state_._4_1_ = !bVar5;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
            if (s.state_._4_4_ == 0) {
              local_7a4 = 0;
              testing::internal::CmpHelperGE<int,int>
                        ((internal *)local_7a0,"w","0",&local_740,&local_7a4);
              bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
              if (!bVar5) {
                testing::Message::Message(&local_7b0);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x7b7,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_7b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_7b0);
              }
              s.state_._5_3_ = 0;
              s.state_._4_1_ = !bVar5;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
              if (s.state_._4_4_ == 0) {
                testing::internal::CmpHelperLT<int,int>
                          ((internal *)local_7c8,"w","kNumThreads",&local_740,
                           &(anonymous_namespace)::kNumThreads);
                bVar5 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_7c8);
                if (!bVar5) {
                  testing::Message::Message(&local_7d0);
                  pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7c8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x7b8,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_6.message_,&local_7d0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_);
                  testing::Message::~Message(&local_7d0);
                }
                s.state_._5_3_ = 0;
                s.state_._4_1_ = !bVar5;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
                if (s.state_._4_4_ == 0) {
                  lVar3 = *arg;
                  lVar8 = (long)local_740;
                  std::operator&(memory_order_acquire,__memory_order_mask);
                  local_7ec = *(int *)(lVar3 + 0xc + lVar8 * 4);
                  testing::internal::CmpHelperLE<int,int>
                            ((internal *)local_7e8,"c",
                             "t->state->counter[w].load(std::memory_order_acquire)",
                             (int *)((long)&gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 4),&local_7ec);
                  bVar5 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_7e8);
                  if (!bVar5) {
                    testing::Message::Message(&local_7f8);
                    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_800,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                               ,0x7b9,pcVar6);
                    testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
                    testing::internal::AssertHelper::~AssertHelper(&local_800);
                    testing::Message::~Message(&local_7f8);
                  }
                  s.state_._5_3_ = 0;
                  s.state_._4_1_ = !bVar5;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
                  if (s.state_._4_4_ == 0) goto LAB_00135525;
                }
              }
            }
          }
        }
      }
      Status::~Status(&local_6f0);
    }
    if (s.state_._4_4_ != 0) goto LAB_001355a0;
    value.field_2._12_4_ = value.field_2._12_4_ + 1;
    s.state_._4_4_ = 0;
  }
  std::atomic<bool>::store
            ((atomic<bool> *)(*arg + 0x1c + (long)(int)uVar1),true,memory_order_release);
  fprintf(_stderr,"... stopping thread %d after %d ops\n",(ulong)uVar1,
          (ulong)(uint)value.field_2._12_4_);
  s.state_._4_4_ = 0;
LAB_001355a0:
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

static void MTThreadBody(void* arg) {
  MTThread* t = reinterpret_cast<MTThread*>(arg);
  int id = t->id;
  DB* db = t->state->test->db_;
  int counter = 0;
  std::fprintf(stderr, "... starting thread %d\n", id);
  Random rnd(1000 + id);
  std::string value;
  char valbuf[1500];
  while (!t->state->stop.load(std::memory_order_acquire)) {
    t->state->counter[id].store(counter, std::memory_order_release);

    int key = rnd.Uniform(kNumKeys);
    char keybuf[20];
    std::snprintf(keybuf, sizeof(keybuf), "%016d", key);

    if (rnd.OneIn(2)) {
      // Write values of the form <key, my id, counter>.
      // We add some padding for force compactions.
      std::snprintf(valbuf, sizeof(valbuf), "%d.%d.%-1000d", key, id,
                    static_cast<int>(counter));
      ASSERT_LEVELDB_OK(db->Put(WriteOptions(), Slice(keybuf), Slice(valbuf)));
    } else {
      // Read a value and verify that it matches the pattern written above.
      Status s = db->Get(ReadOptions(), Slice(keybuf), &value);
      if (s.IsNotFound()) {
        // Key has not yet been written
      } else {
        // Check that the writer thread counter is >= the counter in the value
        ASSERT_LEVELDB_OK(s);
        int k, w, c;
        ASSERT_EQ(3, sscanf(value.c_str(), "%d.%d.%d", &k, &w, &c)) << value;
        ASSERT_EQ(k, key);
        ASSERT_GE(w, 0);
        ASSERT_LT(w, kNumThreads);
        ASSERT_LE(c, t->state->counter[w].load(std::memory_order_acquire));
      }
    }
    counter++;
  }
  t->state->thread_done[id].store(true, std::memory_order_release);
  std::fprintf(stderr, "... stopping thread %d after %d ops\n", id, counter);
}